

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O2

void __thiscall
discordpp::field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>::
field(field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_> *this,
     field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_> *f)

{
  if ((f->t_)._M_t.
      super___uniq_ptr_impl<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>,_std::default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_std::default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>_>
      .
      super__Head_base<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_false>
      ._M_head_impl ==
      (vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_> *)0x0) {
    (this->t_)._M_t.
    super___uniq_ptr_impl<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>,_std::default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_std::default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>_>
    .
    super__Head_base<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_false>
    ._M_head_impl = (vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_> *)0x0;
  }
  else {
    std::
    make_unique<std::vector<discordpp::ChannelType,std::allocator<discordpp::ChannelType>>,std::vector<discordpp::ChannelType,std::allocator<discordpp::ChannelType>>&>
              ((vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_> *)this);
  }
  this->s_ = f->s_;
  return;
}

Assistant:

field(const field<T> &f)
        : t_(f.t_ ? std::make_unique<T>(*f.t_) : nullptr), s_(f.s_) {}